

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCD.h
# Opt level: O0

void __thiscall
dg::llvmdg::SCD::SCD(SCD *this,Module *module,LLVMControlDependenceAnalysisOptions *opts)

{
  LLVMControlDependenceAnalysisOptions *in_RSI;
  LLVMControlDependenceAnalysisOptions *in_RDI;
  Module *in_stack_ffffffffffffff88;
  LLVMControlDependenceAnalysisImpl *in_stack_ffffffffffffff90;
  
  LLVMControlDependenceAnalysisOptions::LLVMControlDependenceAnalysisOptions(in_RDI,in_RSI);
  LLVMControlDependenceAnalysisImpl::LLVMControlDependenceAnalysisImpl
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_RDI);
  LLVMControlDependenceAnalysisOptions::~LLVMControlDependenceAnalysisOptions(in_RDI);
  *(undefined ***)&in_RDI->super_LLVMAnalysisOptions = &PTR__SCD_0029ea18;
  std::
  unordered_map<const_llvm::BasicBlock_*,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>_>
  ::unordered_map((unordered_map<const_llvm::BasicBlock_*,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>_>
                   *)0x231927);
  std::
  unordered_map<const_llvm::BasicBlock_*,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>_>
  ::unordered_map((unordered_map<const_llvm::BasicBlock_*,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>_>
                   *)0x231938);
  std::
  set<const_llvm::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<const_llvm::Function_*>_>
  ::set((set<const_llvm::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<const_llvm::Function_*>_>
         *)0x231949);
  return;
}

Assistant:

SCD(const llvm::Module *module,
        const LLVMControlDependenceAnalysisOptions &opts = {})
            : LLVMControlDependenceAnalysisImpl(module, opts) {}